

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,int attr)

{
  ulong uVar1;
  xmlChar *pxVar2;
  long lVar3;
  char *pcVar4;
  xmlChar *pxVar5;
  bool bVar6;
  char *local_c8;
  char *ptr_1;
  char buf_1 [11];
  int l;
  int val;
  char *ptr;
  char buf [11];
  size_t new_size_2;
  xmlChar *tmp_2;
  size_t new_size_1;
  xmlChar *tmp_1;
  xmlChar *end;
  size_t new_size;
  xmlChar *tmp;
  size_t indx;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  int html;
  size_t buffer_size;
  xmlChar *out;
  xmlChar *buffer;
  xmlChar *cur;
  int attr_local;
  xmlChar *input_local;
  xmlDocPtr doc_local;
  
  bVar6 = false;
  if (input != (xmlChar *)0x0) {
    if (doc != (xmlDocPtr)0x0) {
      bVar6 = doc->type == XML_HTML_DOCUMENT_NODE;
    }
    _uStack_48 = 1000;
    buffer_size = (size_t)(*xmlMalloc)(1000);
    out = (xmlChar *)buffer_size;
    buffer = input;
    if ((xmlChar *)buffer_size != (xmlChar *)0x0) {
LAB_001511ef:
      if (*buffer == '\0') {
        *(undefined1 *)buffer_size = 0;
        return out;
      }
      if (_uStack_48 < (buffer_size - (long)out) + 100) {
        uVar1 = _uStack_48 << 1;
        if ((uVar1 < _uStack_48) ||
           (pxVar2 = (xmlChar *)(*xmlRealloc)(out,uVar1), pxVar2 == (xmlChar *)0x0)) {
LAB_00151c58:
          xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
          (*xmlFree)(out);
          return (xmlChar *)0x0;
        }
        buffer_size = (size_t)(pxVar2 + (buffer_size - (long)out));
        _uStack_48 = uVar1;
        out = pxVar2;
      }
      if (*buffer == '<') {
        if ((((bVar6) && (attr != 0)) &&
            ((buffer[1] == '!' && ((buffer[2] == '-' && (buffer[3] == '-')))))) &&
           (pxVar2 = xmlStrstr(buffer,"-->"), pxVar2 != (xmlChar *)0x0)) {
          while (buffer != pxVar2) {
            pxVar5 = buffer + 1;
            *(xmlChar *)buffer_size = *buffer;
            lVar3 = (buffer_size + 1) - (long)out;
            buffer_size = buffer_size + 1;
            buffer = pxVar5;
            if (_uStack_48 < lVar3 + 100U) {
              uVar1 = _uStack_48 << 1;
              if ((uVar1 < _uStack_48) ||
                 (pxVar5 = (xmlChar *)(*xmlRealloc)(out,uVar1), pxVar5 == (xmlChar *)0x0))
              goto LAB_00151c58;
              buffer_size = (size_t)(pxVar5 + lVar3);
              _uStack_48 = uVar1;
              out = pxVar5;
            }
          }
          *(xmlChar *)buffer_size = *buffer;
          *(xmlChar *)(buffer_size + 1) = buffer[1];
          *(xmlChar *)(buffer_size + 2) = buffer[2];
          buffer_size = buffer_size + 3;
          buffer = buffer + 3;
          goto LAB_001511ef;
        }
        *(undefined1 *)buffer_size = 0x26;
        *(undefined1 *)(buffer_size + 1) = 0x6c;
        *(undefined1 *)(buffer_size + 2) = 0x74;
        *(undefined1 *)(buffer_size + 3) = 0x3b;
        buffer_size = buffer_size + 4;
      }
      else {
        if (*buffer == '>') {
          *(undefined1 *)buffer_size = 0x26;
          *(undefined1 *)(buffer_size + 1) = 0x67;
          *(undefined1 *)(buffer_size + 2) = 0x74;
          *(undefined1 *)(buffer_size + 3) = 0x3b;
          buffer_size = buffer_size + 4;
          goto LAB_00151c36;
        }
        if (*buffer == '&') {
          if ((((!bVar6) || (attr == 0)) || (buffer[1] != '{')) ||
             (pcVar4 = strchr((char *)buffer,0x7d), pcVar4 == (char *)0x0)) {
            *(undefined1 *)buffer_size = 0x26;
            *(undefined1 *)(buffer_size + 1) = 0x61;
            *(undefined1 *)(buffer_size + 2) = 0x6d;
            *(undefined1 *)(buffer_size + 3) = 0x70;
            *(undefined1 *)(buffer_size + 4) = 0x3b;
            buffer_size = buffer_size + 5;
            goto LAB_00151c36;
          }
          while (*buffer != '}') {
            pxVar2 = buffer + 1;
            *(xmlChar *)buffer_size = *buffer;
            lVar3 = (buffer_size + 1) - (long)out;
            buffer_size = buffer_size + 1;
            buffer = pxVar2;
            if (_uStack_48 < lVar3 + 100U) {
              buf._3_8_ = _uStack_48 << 1;
              if (((ulong)buf._3_8_ < _uStack_48) ||
                 (pxVar2 = (xmlChar *)(*xmlRealloc)(out,buf._3_8_), pxVar2 == (xmlChar *)0x0))
              goto LAB_00151c58;
              uStack_48 = buf[3];
              uStack_47 = buf[4];
              uStack_46 = buf[5];
              uStack_45 = buf[6];
              html._0_1_ = buf[7];
              html._1_1_ = buf[8];
              html._2_1_ = buf[9];
              html._3_1_ = buf[10];
              buffer_size = (size_t)(pxVar2 + lVar3);
              out = pxVar2;
            }
          }
          *(xmlChar *)buffer_size = *buffer;
          buffer_size = buffer_size + 1;
          buffer = buffer + 1;
          goto LAB_001511ef;
        }
        if ((((0x1f < *buffer) && (*buffer < 0x80)) || ((*buffer == '\n' || (*buffer == '\t')))) ||
           ((bVar6 && (*buffer == '\r')))) {
          *(xmlChar *)buffer_size = *buffer;
          buffer_size = buffer_size + 1;
        }
        else {
          if (*buffer < 0x80) {
            if ((((8 < *buffer) && (*buffer < 0xb)) || (*buffer == '\r')) || (0x1f < *buffer)) {
              snprintf((char *)((long)&ptr_1 + 5),0xb,"&#%d;",(ulong)*buffer);
              buf_1[2] = '\0';
              local_c8 = (char *)((long)&ptr_1 + 5);
              while (*local_c8 != '\0') {
                *(char *)buffer_size = *local_c8;
                local_c8 = local_c8 + 1;
                buffer_size = buffer_size + 1;
              }
            }
            goto LAB_00151c36;
          }
          if (((doc == (xmlDocPtr)0x0) || (doc->encoding == (xmlChar *)0x0)) && (!bVar6)) {
            buf_1[7] = '\0';
            buf_1[8] = '\0';
            buf_1[9] = '\0';
            buf_1[10] = '\0';
            buf_1[3] = '\x01';
            buf_1[4] = '\0';
            buf_1[5] = '\0';
            buf_1[6] = '\0';
            if ((((((*buffer & 0xc0) == 0xc0) && ((buffer[1] & 0xc0) == 0x80)) &&
                 (((*buffer & 0xe0) != 0xe0 || ((buffer[2] & 0xc0) == 0x80)))) &&
                (((*buffer & 0xf0) != 0xf0 || ((buffer[3] & 0xc0) == 0x80)))) &&
               ((*buffer & 0xf8) != 0xf8)) {
              if (*buffer < 0xe0) {
                buf_1._7_4_ = buffer[1] & 0x3f | (*buffer & 0x1f) << 6;
                buf_1[3] = '\x02';
                buf_1[4] = '\0';
                buf_1[5] = '\0';
                buf_1[6] = '\0';
              }
              else if (*buffer < 0xf0) {
                buf_1._7_4_ = buffer[2] & 0x3f | (buffer[1] & 0x3f | (*buffer & 0xf) << 6) << 6;
                buf_1[3] = '\x03';
                buf_1[4] = '\0';
                buf_1[5] = '\0';
                buf_1[6] = '\0';
              }
              else if (*buffer < 0xf8) {
                buf_1._7_4_ = buffer[3] & 0x3f |
                              (buffer[2] & 0x3f | (buffer[1] & 0x3f | (*buffer & 7) << 6) << 6) << 6
                ;
                buf_1[3] = '\x04';
                buf_1[4] = '\0';
                buf_1[5] = '\0';
                buf_1[6] = '\0';
              }
              if (buf_1._3_4_ == 1) {
LAB_00151a48:
                xmlEntitiesErr(XML_ERR_INVALID_CHAR,"xmlEncodeEntities: char out of range\n");
                if (doc != (xmlDocPtr)0x0) {
                  pxVar2 = xmlStrdup((xmlChar *)"ISO-8859-1");
                  doc->encoding = pxVar2;
                }
                snprintf((char *)((long)&ptr + 5),0xb,"&#%d;",(ulong)*buffer);
                buf[2] = '\0';
                _l = (char *)((long)&ptr + 5);
                while (*_l != '\0') {
                  *(char *)buffer_size = *_l;
                  _l = _l + 1;
                  buffer_size = buffer_size + 1;
                }
                buffer = buffer + 1;
              }
              else {
                if ((uint)buf_1._7_4_ < 0x100) {
                  if ((((uint)buf_1._7_4_ < 9) || (10 < (uint)buf_1._7_4_)) &&
                     ((buf_1._7_4_ != 0xd && ((uint)buf_1._7_4_ < 0x20)))) goto LAB_00151a48;
                }
                else if (((((uint)buf_1._7_4_ < 0x100) || (0xd7ff < (uint)buf_1._7_4_)) &&
                         (((uint)buf_1._7_4_ < 0xe000 || (0xfffd < (uint)buf_1._7_4_)))) &&
                        (((uint)buf_1._7_4_ < 0x10000 || (0x10ffff < (uint)buf_1._7_4_))))
                goto LAB_00151a48;
                snprintf((char *)((long)&ptr + 5),0xb,"&#x%X;",(ulong)(uint)buf_1._7_4_);
                buf[2] = '\0';
                _l = (char *)((long)&ptr + 5);
                while (*_l != '\0') {
                  *(char *)buffer_size = *_l;
                  _l = _l + 1;
                  buffer_size = buffer_size + 1;
                }
                buffer = buffer + (int)buf_1._3_4_;
              }
            }
            else {
              xmlEntitiesErr(XML_CHECK_NOT_UTF8,"xmlEncodeEntities: input not UTF-8");
              if (doc != (xmlDocPtr)0x0) {
                pxVar2 = xmlStrdup((xmlChar *)"ISO-8859-1");
                doc->encoding = pxVar2;
              }
              snprintf((char *)((long)&ptr + 5),0xb,"&#%d;",(ulong)*buffer);
              buf[2] = '\0';
              _l = (char *)((long)&ptr + 5);
              while (*_l != '\0') {
                *(char *)buffer_size = *_l;
                _l = _l + 1;
                buffer_size = buffer_size + 1;
              }
              buffer = buffer + 1;
            }
            goto LAB_001511ef;
          }
          *(xmlChar *)buffer_size = *buffer;
          buffer_size = buffer_size + 1;
        }
      }
LAB_00151c36:
      buffer = buffer + 1;
      goto LAB_001511ef;
    }
    xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input, int attr) {
    const xmlChar *cur = input;
    xmlChar *buffer = NULL;
    xmlChar *out = NULL;
    size_t buffer_size = 0;
    int html = 0;

    if (input == NULL) return(NULL);
    if (doc != NULL)
        html = (doc->type == XML_HTML_DOCUMENT_NODE);

    /*
     * allocate an translation buffer.
     */
    buffer_size = 1000;
    buffer = (xmlChar *) xmlMalloc(buffer_size);
    if (buffer == NULL) {
        xmlEntitiesErrMemory("xmlEncodeEntities: malloc failed");
	return(NULL);
    }
    out = buffer;

    while (*cur != '\0') {
        size_t indx = out - buffer;
        if (indx + 100 > buffer_size) {

	    growBufferReentrant();
	    out = &buffer[indx];
	}

	/*
	 * By default one have to encode at least '<', '>', '"' and '&' !
	 */
	if (*cur == '<') {
	    const xmlChar *end;

	    /*
	     * Special handling of server side include in HTML attributes
	     */
	    if (html && attr &&
	        (cur[1] == '!') && (cur[2] == '-') && (cur[3] == '-') &&
	        ((end = xmlStrstr(cur, BAD_CAST "-->")) != NULL)) {
	        while (cur != end) {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		*out++ = *cur++;
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '>') {
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	} else if (*cur == '&') {
	    /*
	     * Special handling of &{...} construct from HTML 4, see
	     * http://www.w3.org/TR/html401/appendix/notes.html#h-B.7.1
	     */
	    if (html && attr && (cur[1] == '{') &&
	        (strchr((const char *) cur, '}'))) {
	        while (*cur != '}') {
		    *out++ = *cur++;
		    indx = out - buffer;
		    if (indx + 100 > buffer_size) {
			growBufferReentrant();
			out = &buffer[indx];
		    }
		}
		*out++ = *cur++;
		continue;
	    }
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	} else if (((*cur >= 0x20) && (*cur < 0x80)) ||
	    (*cur == '\n') || (*cur == '\t') || ((html) && (*cur == '\r'))) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *cur;
	} else if (*cur >= 0x80) {
	    if (((doc != NULL) && (doc->encoding != NULL)) || (html)) {
		/*
		 * Bjørn Reese <br@sseusa.com> provided the patch
	        xmlChar xc;
	        xc = (*cur & 0x3F) << 6;
	        if (cur[1] != 0) {
		    xc += *(++cur) & 0x3F;
		    *out++ = xc;
	        } else
		 */
		*out++ = *cur;
	    } else {
		/*
		 * We assume we have UTF-8 input.
		 * It must match either:
		 *   110xxxxx 10xxxxxx
		 *   1110xxxx 10xxxxxx 10xxxxxx
		 *   11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
		 * That is:
		 *   cur[0] is 11xxxxxx
		 *   cur[1] is 10xxxxxx
		 *   cur[2] is 10xxxxxx if cur[0] is 111xxxxx
		 *   cur[3] is 10xxxxxx if cur[0] is 1111xxxx
		 *   cur[0] is not 11111xxx
		 */
		char buf[11], *ptr;
		int val = 0, l = 1;

		if (((cur[0] & 0xC0) != 0xC0) ||
		    ((cur[1] & 0xC0) != 0x80) ||
		    (((cur[0] & 0xE0) == 0xE0) && ((cur[2] & 0xC0) != 0x80)) ||
		    (((cur[0] & 0xF0) == 0xF0) && ((cur[3] & 0xC0) != 0x80)) ||
		    (((cur[0] & 0xF8) == 0xF8))) {
		    xmlEntitiesErr(XML_CHECK_NOT_UTF8,
			    "xmlEncodeEntities: input not UTF-8");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		} else if (*cur < 0xE0) {
                    val = (cur[0]) & 0x1F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    l = 2;
		} else if (*cur < 0xF0) {
                    val = (cur[0]) & 0x0F;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    l = 3;
		} else if (*cur < 0xF8) {
                    val = (cur[0]) & 0x07;
		    val <<= 6;
		    val |= (cur[1]) & 0x3F;
		    val <<= 6;
		    val |= (cur[2]) & 0x3F;
		    val <<= 6;
		    val |= (cur[3]) & 0x3F;
		    l = 4;
		}
		if ((l == 1) || (!IS_CHAR(val))) {
		    xmlEntitiesErr(XML_ERR_INVALID_CHAR,
			"xmlEncodeEntities: char out of range\n");
		    if (doc != NULL)
			doc->encoding = xmlStrdup(BAD_CAST "ISO-8859-1");
		    snprintf(buf, sizeof(buf), "&#%d;", *cur);
		    buf[sizeof(buf) - 1] = 0;
		    ptr = buf;
		    while (*ptr != 0) *out++ = *ptr++;
		    cur++;
		    continue;
		}
		/*
		 * We could do multiple things here. Just save as a char ref
		 */
		snprintf(buf, sizeof(buf), "&#x%X;", val);
		buf[sizeof(buf) - 1] = 0;
		ptr = buf;
		while (*ptr != 0) *out++ = *ptr++;
		cur += l;
		continue;
	    }
	} else if (IS_BYTE_CHAR(*cur)) {
	    char buf[11], *ptr;

	    snprintf(buf, sizeof(buf), "&#%d;", *cur);
	    buf[sizeof(buf) - 1] = 0;
            ptr = buf;
	    while (*ptr != 0) *out++ = *ptr++;
	}
	cur++;
    }
    *out = 0;
    return(buffer);

mem_error:
    xmlEntitiesErrMemory("xmlEncodeEntities: realloc failed");
    xmlFree(buffer);
    return(NULL);
}